

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomResourceIcon::write(DomResourceIcon *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QString local_40;
  long local_28;
  
  aVar2._4_4_ = in_register_00000034;
  aVar2._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"resourceicon";
    local_40.d.size = 0xc;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar3.m_size = (size_t)local_40.d.ptr;
  QVar3.field_0.m_data = aVar2.m_data;
  QXmlStreamWriter::writeStartElement(QVar3);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_theme == true) {
    pQVar1 = &((this->m_attr_theme).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_theme).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar5.m_size = (size_t)L"theme";
      QVar5.field_0.m_data = aVar2.m_data;
      QVar10.m_size = __n;
      QVar10.field_0.m_data = (void *)0x8000000000000005;
      QXmlStreamWriter::writeAttribute(QVar5,QVar10);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar4.m_size = (size_t)L"theme";
      QVar4.field_0.m_data = aVar2.m_data;
      QVar9.m_size = __n;
      QVar9.field_0.m_data = (void *)0x8000000000000005;
      QXmlStreamWriter::writeAttribute(QVar4,QVar9);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_resource == true) {
    pQVar1 = &((this->m_attr_resource).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_resource).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar7.m_size = (size_t)L"resource";
      QVar7.field_0.m_data = aVar2.m_data;
      QVar12.m_size = __n;
      QVar12.field_0.m_data = (void *)0x8000000000000008;
      QXmlStreamWriter::writeAttribute(QVar7,QVar12);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar6.m_size = (size_t)L"resource";
      QVar6.field_0.m_data = aVar2.m_data;
      QVar11.m_size = __n;
      QVar11.field_0.m_data = (void *)0x8000000000000008;
      QXmlStreamWriter::writeAttribute(QVar6,QVar11);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if ((this->m_children & 1) != 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"normaloff";
    local_40.d.size = 9;
    DomResourcePixmap::write(this->m_normalOff,__fd,&local_40,__n);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 2) != 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"normalon";
    local_40.d.size = 8;
    DomResourcePixmap::write(this->m_normalOn,__fd,&local_40,__n);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 4) != 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"disabledoff";
    local_40.d.size = 0xb;
    DomResourcePixmap::write(this->m_disabledOff,__fd,&local_40,__n);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 8) != 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"disabledon";
    local_40.d.size = 10;
    DomResourcePixmap::write(this->m_disabledOn,__fd,&local_40,__n);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x10) != 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"activeoff";
    local_40.d.size = 9;
    DomResourcePixmap::write(this->m_activeOff,__fd,&local_40,__n);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x20) != 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"activeon";
    local_40.d.size = 8;
    DomResourcePixmap::write(this->m_activeOn,__fd,&local_40,__n);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x40) != 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"selectedoff";
    local_40.d.size = 0xb;
    DomResourcePixmap::write(this->m_selectedOff,__fd,&local_40,__n);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x80) != 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"selectedon";
    local_40.d.size = 10;
    DomResourcePixmap::write(this->m_selectedOn,__fd,&local_40,__n);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_text).d.size != 0) {
    QVar8.m_size = (size_t)(this->m_text).d.ptr;
    QVar8.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeCharacters(QVar8);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomResourceIcon::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("resourceicon") : tagName.toLower());

    if (hasAttributeTheme())
        writer.writeAttribute(u"theme"_s, attributeTheme());

    if (hasAttributeResource())
        writer.writeAttribute(u"resource"_s, attributeResource());

    if (m_children & NormalOff)
        m_normalOff->write(writer, u"normaloff"_s);

    if (m_children & NormalOn)
        m_normalOn->write(writer, u"normalon"_s);

    if (m_children & DisabledOff)
        m_disabledOff->write(writer, u"disabledoff"_s);

    if (m_children & DisabledOn)
        m_disabledOn->write(writer, u"disabledon"_s);

    if (m_children & ActiveOff)
        m_activeOff->write(writer, u"activeoff"_s);

    if (m_children & ActiveOn)
        m_activeOn->write(writer, u"activeon"_s);

    if (m_children & SelectedOff)
        m_selectedOff->write(writer, u"selectedoff"_s);

    if (m_children & SelectedOn)
        m_selectedOn->write(writer, u"selectedon"_s);

    if (!m_text.isEmpty())
        writer.writeCharacters(m_text);

    writer.writeEndElement();
}